

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTracer.cpp
# Opt level: O2

void __thiscall
PathTracer::Reset(PathTracer *this,shared_ptr<myvk::CommandPool> *command_pool,
                 shared_ptr<myvk::Queue> *shared_queue)

{
  Camera *this_00;
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  initializer_list<std::shared_ptr<myvk::Queue>_> __l;
  allocator_type local_65;
  float local_64;
  vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> local_60;
  __shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  this_00 = (this->m_camera_ptr).super___shared_ptr<Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_64 = this_00->m_aspect_ratio;
  this_00->m_aspect_ratio = (float)this->m_width / (float)this->m_height;
  Camera::UpdateFrameUniformBuffer(this_00,3);
  ((this->m_camera_ptr).super___shared_ptr<Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  m_aspect_ratio = local_64;
  Sobol::Reset(&this->m_sobol,command_pool,this->m_bounce * 2 + 2);
  iVar1 = (*(((command_pool->super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  std::__shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_48,
             &(((command_pool->super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr)->m_queue_ptr).super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38,&shared_queue->super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>);
  __l._M_len = 2;
  __l._M_array = (iterator)&local_48;
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::vector
            (&local_60,__l,&local_65);
  create_target_images(this,(shared_ptr<myvk::Device> *)CONCAT44(extraout_var,iVar1),&local_60);
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            (&local_60);
  lVar2 = 0x18;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&local_48._M_ptr + lVar2));
    lVar2 = lVar2 + -0x10;
  } while (lVar2 != -8);
  clear_target_images(this,command_pool);
  myvk::DescriptorSet::UpdateStorageImage
            ((this->m_target_descriptor_set).
             super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &this->m_color_image_view,0,0);
  myvk::DescriptorSet::UpdateStorageImage
            ((this->m_target_descriptor_set).
             super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &this->m_albedo_image_view,1,0);
  myvk::DescriptorSet::UpdateStorageImage
            ((this->m_target_descriptor_set).
             super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &this->m_normal_image_view,2,0);
  return;
}

Assistant:

void PathTracer::Reset(const std::shared_ptr<myvk::CommandPool> &command_pool,
                       const std::shared_ptr<myvk::Queue> &shared_queue) {
	{
		float tmp = m_camera_ptr->m_aspect_ratio;
		m_camera_ptr->m_aspect_ratio = m_width / float(m_height);
		m_camera_ptr->UpdateFrameUniformBuffer(kFrameCount);
		m_camera_ptr->m_aspect_ratio = tmp;
	}
	m_sobol.Reset(command_pool, (m_bounce + 1) * 2);
	create_target_images(command_pool->GetDevicePtr(), {command_pool->GetQueuePtr(), shared_queue});
	clear_target_images(command_pool);
	m_target_descriptor_set->UpdateStorageImage(m_color_image_view, 0);
	m_target_descriptor_set->UpdateStorageImage(m_albedo_image_view, 1);
	m_target_descriptor_set->UpdateStorageImage(m_normal_image_view, 2);
}